

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool uxpgnt_ask_passphrase(PageantListenerClient *plc,PageantClientDialogId *dlgid,char *comment)

{
  int iVar1;
  char *msg_00;
  char *msg;
  uxpgnt_client *upc;
  char *comment_local;
  PageantClientDialogId *dlgid_local;
  PageantListenerClient *plc_local;
  
  if (plc[-1].vt != (PageantListenerClientVtable *)0x0) {
    __assert_fail("!upc->dlgid",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                  ,0x6f,
                  "_Bool uxpgnt_ask_passphrase(PageantListenerClient *, PageantClientDialogId *, const char *)"
                 );
  }
  msg_00 = dupprintf("A client of Pageant wants to use the following encrypted key:\n%s\nIf you intended this, enter the passphrase to decrypt the key."
                     ,comment);
  iVar1 = *(int *)&plc[-2].suppress_logging;
  if (iVar1 == 0) {
    safefree(msg_00);
    plc_local._7_1_ = false;
  }
  else {
    if (iVar1 == 1) {
      fprintf(*(FILE **)&plc[-3].suppress_logging,"pageant passphrase request: %s\n",msg_00);
      safefree(msg_00);
    }
    else if (iVar1 == 2) {
      iVar1 = make_pipe_to_askpass(msg_00);
      *(int *)&plc[-1].suppress_logging = iVar1;
      safefree(msg_00);
      if (*(int *)&plc[-1].suppress_logging < 0) {
        return false;
      }
    }
    plc[-2].field_0xc = 1;
    plc[-1].vt = (PageantListenerClientVtable *)dlgid;
    plc_local._7_1_ = true;
  }
  return plc_local._7_1_;
}

Assistant:

static bool uxpgnt_ask_passphrase(
    PageantListenerClient *plc, PageantClientDialogId *dlgid,
    const char *comment)
{
    struct uxpgnt_client *upc = container_of(plc, struct uxpgnt_client, plc);

    assert(!upc->dlgid); /* Pageant core should be serialising requests */

    char *msg = dupprintf(
        "A client of Pageant wants to use the following encrypted key:\n"
        "%s\n"
        "If you intended this, enter the passphrase to decrypt the key.",
        comment);

    switch (upc->prompt_type) {
      case RTPROMPT_UNAVAILABLE:
        sfree(msg);
        return false;

      case RTPROMPT_GUI:
        upc->passphrase_fd = make_pipe_to_askpass(msg);
        sfree(msg);
        if (upc->passphrase_fd < 0)
            return false; /* something went wrong */
        break;

      case RTPROMPT_DEBUG:
        fprintf(upc->logfp, "pageant passphrase request: %s\n", msg);
        sfree(msg);
        break;
    }

    upc->prompt_active = true;
    upc->dlgid = dlgid;
    return true;
}